

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

void unres_data_del(unres_data *unres,uint32_t i)

{
  uint32_t i_local;
  unres_data *unres_local;
  
  if (i + 1 < unres->count) {
    memmove(unres->node + i,unres->node + (i + 1),(ulong)(unres->count - (i + 1)) << 3);
  }
  else if (i == 0) {
    free(unres->node);
    unres->node = (lyd_node **)0x0;
  }
  unres->count = unres->count - 1;
  return;
}

Assistant:

void
unres_data_del(struct unres_data *unres, uint32_t i)
{
    /* there are items after the one deleted */
    if (i+1 < unres->count) {
        /* we only move the data, memory is left allocated, why bother */
        memmove(&unres->node[i], &unres->node[i+1], (unres->count-(i+1)) * sizeof *unres->node);

    /* deleting the last item */
    } else if (i == 0) {
        free(unres->node);
        unres->node = NULL;
    }

    /* if there are no items after and it is not the last one, just move the counter */
    --unres->count;
}